

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_refine(lys_ypr_ctx_conflict *pctx,lysp_refine *refine)

{
  ulong local_48;
  ulong local_38;
  int8_t local_21;
  ulong uStack_20;
  int8_t flag;
  uint64_t u;
  lysp_refine *refine_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_21 = '\0';
  u = (uint64_t)refine;
  refine_local = (lysp_refine *)pctx;
  ypr_open(pctx,"refine","target-node",refine->nodeid,'\0');
  *(short *)&refine_local->dsc = *(short *)&refine_local->dsc + 1;
  yprp_extension_instances
            ((lys_ypr_ctx_conflict *)refine_local,LY_STMT_REFINE,'\0',
             *(lysp_ext_instance **)(u + 0x40),&local_21);
  yprp_iffeatures((lys_ypr_ctx_conflict *)refine_local,*(lysp_qname **)(u + 0x18),
                  *(lysp_ext_instance **)(u + 0x40),&local_21);
  uStack_20 = 0;
  while( true ) {
    if (*(long *)(u + 0x20) == 0) {
      local_38 = 0;
    }
    else {
      local_38 = *(ulong *)(*(long *)(u + 0x20) + -8);
    }
    if (local_38 <= uStack_20) break;
    ypr_close_parent((lys_ypr_ctx_conflict *)refine_local,&local_21);
    yprp_restr((lys_ypr_ctx_conflict *)refine_local,
               (lysp_restr *)(*(long *)(u + 0x20) + uStack_20 * 0x40),LY_STMT_MUST,"condition",
               &local_21);
    uStack_20 = uStack_20 + 1;
  }
  if (*(long *)(u + 0x28) != 0) {
    ypr_close_parent((lys_ypr_ctx_conflict *)refine_local,&local_21);
    ypr_substmt((lys_ypr_ctx_conflict *)refine_local,LY_STMT_PRESENCE,'\0',*(char **)(u + 0x28),
                *(void **)(u + 0x40));
  }
  uStack_20 = 0;
  while( true ) {
    if (*(long *)(u + 0x30) == 0) {
      local_48 = 0;
    }
    else {
      local_48 = *(ulong *)(*(long *)(u + 0x30) + -8);
    }
    if (local_48 <= uStack_20) break;
    ypr_close_parent((lys_ypr_ctx_conflict *)refine_local,&local_21);
    ypr_substmt((lys_ypr_ctx_conflict *)refine_local,LY_STMT_DEFAULT,(uint8_t)uStack_20,
                *(char **)(*(long *)(u + 0x30) + uStack_20 * 0x18),*(void **)(u + 0x40));
    uStack_20 = uStack_20 + 1;
  }
  ypr_config((lys_ypr_ctx_conflict *)refine_local,*(uint16_t *)(u + 0x48),*(void **)(u + 0x40),
             &local_21);
  ypr_mandatory((lys_ypr_ctx_conflict *)refine_local,*(uint16_t *)(u + 0x48),*(void **)(u + 0x40),
                &local_21);
  if ((*(ushort *)(u + 0x48) & 0x200) != 0) {
    ypr_close_parent((lys_ypr_ctx_conflict *)refine_local,&local_21);
    ypr_unsigned((lys_ypr_ctx_conflict *)refine_local,LY_STMT_MIN_ELEMENTS,'\0',*(void **)(u + 0x40)
                 ,(ulong)*(uint *)(u + 0x38));
  }
  if ((*(ushort *)(u + 0x48) & 0x400) != 0) {
    ypr_close_parent((lys_ypr_ctx_conflict *)refine_local,&local_21);
    if (*(int *)(u + 0x3c) == 0) {
      ypr_substmt((lys_ypr_ctx_conflict *)refine_local,LY_STMT_MAX_ELEMENTS,'\0',"unbounded",
                  *(void **)(u + 0x40));
    }
    else {
      ypr_unsigned((lys_ypr_ctx_conflict *)refine_local,LY_STMT_MAX_ELEMENTS,'\0',
                   *(void **)(u + 0x40),(ulong)*(uint *)(u + 0x3c));
    }
  }
  ypr_description((lys_ypr_ctx_conflict *)refine_local,*(char **)(u + 8),*(void **)(u + 0x40),
                  &local_21);
  ypr_reference((lys_ypr_ctx_conflict *)refine_local,*(char **)(u + 0x10),*(void **)(u + 0x40),
                &local_21);
  *(short *)&refine_local->dsc = *(short *)&refine_local->dsc + -1;
  ypr_close((lys_ypr_ctx_conflict *)refine_local,"refine",local_21);
  return;
}

Assistant:

static void
yprp_refine(struct lys_ypr_ctx *pctx, struct lysp_refine *refine)
{
    LY_ARRAY_COUNT_TYPE u;
    int8_t flag = 0;

    ypr_open(pctx, "refine", "target-node", refine->nodeid, flag);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_REFINE, 0, refine->exts, &flag);
    yprp_iffeatures(pctx, refine->iffeatures, refine->exts, &flag);

    LY_ARRAY_FOR(refine->musts, u) {
        ypr_close_parent(pctx, &flag);
        yprp_restr(pctx, &refine->musts[u], LY_STMT_MUST, "condition", &flag);
    }

    if (refine->presence) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_PRESENCE, 0, refine->presence, refine->exts);
    }

    LY_ARRAY_FOR(refine->dflts, u) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_DEFAULT, u, refine->dflts[u].str, refine->exts);
    }

    ypr_config(pctx, refine->flags, refine->exts, &flag);
    ypr_mandatory(pctx, refine->flags, refine->exts, &flag);

    if (refine->flags & LYS_SET_MIN) {
        ypr_close_parent(pctx, &flag);
        ypr_unsigned(pctx, LY_STMT_MIN_ELEMENTS, 0, refine->exts, refine->min);
    }
    if (refine->flags & LYS_SET_MAX) {
        ypr_close_parent(pctx, &flag);
        if (refine->max) {
            ypr_unsigned(pctx, LY_STMT_MAX_ELEMENTS, 0, refine->exts, refine->max);
        } else {
            ypr_substmt(pctx, LY_STMT_MAX_ELEMENTS, 0, "unbounded", refine->exts);
        }
    }

    ypr_description(pctx, refine->dsc, refine->exts, &flag);
    ypr_reference(pctx, refine->ref, refine->exts, &flag);

    LEVEL--;
    ypr_close(pctx, "refine", flag);
}